

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

bool __thiscall
soul::SourceCodeOperations::reload
          (SourceCodeOperations *this,CompileMessageList *messageList,CodeLocation *code,
          ApplyModificationFn *applyMod)

{
  bool bVar1;
  CodeLocation local_28;
  
  std::function<void_(const_soul::SourceCodeOperations::TextModificationOp_&)>::operator=
            (&this->applyModification,applyMod);
  local_28.sourceCode.object = (code->sourceCode).object;
  (code->sourceCode).object = (SourceCodeText *)0x0;
  local_28.location.data = (code->location).data;
  bVar1 = reparse(this,messageList,&local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  return bVar1;
}

Assistant:

bool SourceCodeOperations::reload (CompileMessageList& messageList, CodeLocation code, ApplyModificationFn applyMod)
{
    applyModification = std::move (applyMod);
    return reparse (messageList, std::move (code));
}